

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Mul::innerExtrema
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *param_1,Interval *xi,Interval *yi
          )

{
  double dVar1;
  bool bVar2;
  
  dVar1 = xi->m_lo;
  if (((((-INFINITY < dVar1) || (NAN(xi->m_hi))) && ((NAN(dVar1) || (xi->m_hi < INFINITY)))) ||
      ((0.0 < yi->m_lo || (bVar2 = true, yi->m_hi < 0.0)))) &&
     ((((-INFINITY < yi->m_lo || (NAN(yi->m_hi))) && ((NAN(yi->m_lo) || (yi->m_hi < INFINITY)))) ||
      ((0.0 < dVar1 || (bVar2 = true, xi->m_hi < 0.0)))))) {
    bVar2 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar2;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema(const EvalContext&, const Interval& xi, const Interval& yi) const
	{
		if (((xi.contains(-TCU_INFINITY) || xi.contains(TCU_INFINITY)) && yi.contains(0.0)) ||
			((yi.contains(-TCU_INFINITY) || yi.contains(TCU_INFINITY)) && xi.contains(0.0)))
			return Interval(TCU_NAN);

		return Interval();
	}